

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_scene_lights.cxx
# Opt level: O2

void __thiscall xray_re::xr_light_object::load(xr_light_object *this,xr_reader *r)

{
  uint32_t *puVar1;
  uint8_t *puVar2;
  float *pfVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  uint uVar6;
  size_t sVar7;
  char *__assertion;
  uint16_t version;
  d3d_light light;
  
  sVar7 = xr_reader::r_chunk<unsigned_short>(r,0xb411,&version);
  if (sVar7 == 0) {
    __assertion = "0";
    uVar6 = 0x24;
  }
  else if ((version & 0xfffe) == 0x10) {
    xr_custom_object::load(&this->super_xr_custom_object,r);
    sVar7 = xr_reader::find_chunk(r,0xb442);
    if (sVar7 == 0) {
      sVar7 = xr_reader::find_chunk(r,0xb435);
      if (sVar7 == 0) {
        __assertion = "0";
        uVar6 = 0x41;
        goto LAB_00178a0a;
      }
      d3d_light::load(&light,r);
      *(uint32_t *)&(this->super_xr_custom_object).field_0x6c = light.type;
      (this->m_color).r = light.diffuse.r;
      (this->m_color).g = light.diffuse.g;
      (this->m_color).b = light.diffuse.b;
      (this->m_color).a = light.diffuse.a;
      *(undefined8 *)&(this->super_xr_custom_object).m_position.field_0 =
           light.position.field_0._0_8_;
      (this->super_xr_custom_object).m_position.field_0.field_0.z = light.position.field_0.field_0.z
      ;
      this->m_range = light.range;
      this->m_attenuation_constant = light.attenuation0;
      this->m_attenuation_linear = light.attenuation1;
      this->m_attenuation_quadratic = light.attenuation2;
      this->m_cone_angle = light.phi;
      sVar7 = xr_reader::r_chunk<float>(r,0xb425,&this->m_brightness);
      if (sVar7 == 0) {
        __assertion = "0";
        uVar6 = 0x3f;
        goto LAB_00178a0a;
      }
    }
    else {
      puVar1 = (r->field_2).m_p_u32;
      (r->field_2).m_p = (uint8_t *)(puVar1 + 1);
      *(uint32_t *)&(this->super_xr_custom_object).field_0x6c = *puVar1;
      uVar4 = *(undefined8 *)(r->field_2).m_p;
      uVar5 = *(undefined8 *)((r->field_2).m_p + 8);
      (this->m_color).r = (float)(int)uVar4;
      (this->m_color).g = (float)(int)((ulong)uVar4 >> 0x20);
      (this->m_color).b = (float)(int)uVar5;
      (this->m_color).a = (float)(int)((ulong)uVar5 >> 0x20);
      puVar2 = (r->field_2).m_p;
      (r->field_2).m_p = puVar2 + 0x14;
      this->m_brightness = *(float *)(puVar2 + 0x10);
      pfVar3 = (float *)(r->field_2).m_p_u32;
      (r->field_2).m_p = (uint8_t *)(pfVar3 + 1);
      this->m_range = *pfVar3;
      pfVar3 = (float *)(r->field_2).m_p_u32;
      (r->field_2).m_p = (uint8_t *)(pfVar3 + 1);
      this->m_attenuation_constant = *pfVar3;
      pfVar3 = (float *)(r->field_2).m_p_u32;
      (r->field_2).m_p = (uint8_t *)(pfVar3 + 1);
      this->m_attenuation_linear = *pfVar3;
      pfVar3 = (float *)(r->field_2).m_p_u32;
      (r->field_2).m_p = (uint8_t *)(pfVar3 + 1);
      this->m_attenuation_quadratic = *pfVar3;
      pfVar3 = (float *)(r->field_2).m_p_u32;
      (r->field_2).m_p = (uint8_t *)(pfVar3 + 1);
      this->m_cone_angle = *pfVar3;
      pfVar3 = (float *)(r->field_2).m_p_u32;
      (r->field_2).m_p = (uint8_t *)(pfVar3 + 1);
      this->m_unknown = *pfVar3;
    }
    sVar7 = xr_reader::r_chunk<unsigned_int>(r,0xb436,&this->m_use_in_d3d);
    if (sVar7 == 0) {
      __assertion = "0";
      uVar6 = 0x44;
    }
    else {
      if (version == 0x10) {
        sVar7 = xr_reader::r_chunk<xray_re::_vector3<float>>
                          (r,0xb437,&(this->super_xr_custom_object).m_rotation);
        if (sVar7 == 0) {
          *(undefined8 *)&(this->super_xr_custom_object).m_rotation.field_0 = 0;
          (this->super_xr_custom_object).m_rotation.field_0.field_0.z = 0.0;
        }
      }
      puVar1 = &this->m_flags;
      xr_reader::r_chunk<unsigned_int>(r,0xb413,puVar1);
      xr_reader::r_chunk<unsigned_int>(r,0xb441,&this->m_control);
      if (*(int *)&(this->super_xr_custom_object).field_0x6c != 3) {
        sVar7 = xr_reader::find_chunk(r,0xb438);
        if (sVar7 != 0) {
          xr_reader::r_sz(r,&this->m_animation);
        }
        sVar7 = xr_reader::find_chunk(r,0xb439);
        if (sVar7 != 0) {
          xr_reader::r_sz(r,&this->m_texture);
        }
        sVar7 = xr_reader::find_chunk(r,0xb440);
        if (sVar7 == 0) {
          uVar6 = *puVar1 & 0xffffffef;
        }
        else {
          puVar2 = (r->field_2).m_p;
          (r->field_2).m_p = puVar2 + 1;
          (this->m_shape).type = *puVar2;
          uVar4 = *(undefined8 *)(r->field_2).m_p;
          uVar5 = *(undefined8 *)((r->field_2).m_p + 8);
          (this->m_shape).fixme.x = (float)(int)uVar4;
          (this->m_shape).fixme.y = (float)(int)((ulong)uVar4 >> 0x20);
          (this->m_shape).fixme.z = (float)(int)uVar5;
          (this->m_shape).fixme.w = (float)(int)((ulong)uVar5 >> 0x20);
          puVar2 = (r->field_2).m_p;
          (r->field_2).m_p = puVar2 + 0x12;
          xr_reader::
          r_seq<std::vector<xray_re::_vector3<float>,std::allocator<xray_re::_vector3<float>>>>
                    (r,(ulong)*(ushort *)(puVar2 + 0x10),&this->m_vertices);
          uVar6 = this->m_flags | 0x10;
        }
        *puVar1 = uVar6;
        return;
      }
      __assertion = "m_type != D3D_LIGHT_DIRECTIONAL";
      uVar6 = 0x4b;
    }
  }
  else {
    __assertion = "version == LIGHT_VERSION_16 || version == LIGHT_VERSION";
    uVar6 = 0x25;
  }
LAB_00178a0a:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_scene_lights.cxx"
                ,uVar6,"virtual void xray_re::xr_light_object::load(xr_reader &)");
}

Assistant:

void xr_light_object::load(xr_reader& r)
{
	uint16_t version;
	if (!r.r_chunk<uint16_t>(LIGHT_CHUNK_VERSION, version))
		xr_not_expected();
	xr_assert(version == LIGHT_VERSION_16 || version == LIGHT_VERSION);
	xr_custom_object::load(r);
	if (r.find_chunk(LIGHT_CHUNK_PARAMS)) {
		m_type = r.r_u32();
		r.r<fcolor>(m_color);
		m_brightness = r.r_float();
		m_range = r.r_float();
		m_attenuation_constant = r.r_float();
		m_attenuation_linear = r.r_float();
		m_attenuation_quadratic = r.r_float();
		m_cone_angle = r.r_float();
		m_unknown = r.r_float();
		r.debug_find_chunk();
	} else if (r.find_chunk(LIGHT_CHUNK_D3D_PARAMS)) {
		d3d_light light;
		light.load(r);
		m_type = light.type;
		m_color = light.diffuse;
		co_position().set(light.position);
		m_range = light.range;
		m_attenuation_constant = light.attenuation0;
		m_attenuation_linear = light.attenuation1;
		m_attenuation_quadratic = light.attenuation2;
		m_cone_angle = light.phi;
		r.debug_find_chunk();
		if (!r.r_chunk<float>(LIGHT_CHUNK_BRIGHTNESS, m_brightness))
			xr_not_expected();
	} else {
		xr_not_expected();
	}
	if (!r.r_chunk<uint32_t>(LIGHT_CHUNK_USE_IN_D3D, m_use_in_d3d))
		xr_not_expected();
	if (version == LIGHT_VERSION_16 &&
			!r.r_chunk<fvector3>(LIGHT_CHUNK_ROTATION, co_rotation())) {
		co_rotation().set();
	}
	r.r_chunk<uint32_t>(LIGHT_CHUNK_FLAGS, m_flags);
	r.r_chunk<uint32_t>(LIGHT_CHUNK_CONTROL, m_control);
	xr_assert(m_type != D3D_LIGHT_DIRECTIONAL);	// FIXME
	if (r.find_chunk(LIGHT_CHUNK_ANIMATION)) {
		r.r_sz(m_animation);
		r.debug_find_chunk();
	}
	if (r.find_chunk(LIGHT_CHUNK_TEXTURE)) {
		r.r_sz(m_texture);
		r.debug_find_chunk();
	}
	if (r.find_chunk(LIGHT_CHUNK_FUZZY_DATA)) {
		m_shape.type = r.r_u8();
		r.r<fvector4>(m_shape.fixme);
		r.r_seq(r.r_u16(), m_vertices);
		r.debug_find_chunk();
		m_flags |= LIGHT_FLAG_FUZZY;
	} else {
		m_flags &= ~LIGHT_FLAG_FUZZY;
	}
}